

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O2

QpVector * __thiscall Basis::Zprod(Basis *this,QpVector *rhs,QpVector *target)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  QpVector *pQVar9;
  HighsInt i;
  long lVar10;
  
  QpVector::reset(&this->buffer_Zprod);
  (this->buffer_Zprod).dim = target->dim;
  piVar3 = (rhs->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (rhs->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = (this->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
           .super__Vector_impl_data._M_start;
  piVar6 = (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  piVar7 = (this->buffer_Zprod).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar8 = (this->buffer_Zprod).value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar10 = 0; lVar10 < rhs->num_nz; lVar10 = lVar10 + 1) {
    iVar1 = piVar3[lVar10];
    iVar2 = piVar6[piVar5[iVar1]];
    piVar7[lVar10] = iVar2;
    pdVar8[iVar2] = pdVar4[iVar1];
  }
  (this->buffer_Zprod).num_nz = rhs->num_nz;
  pQVar9 = btran(this,&this->buffer_Zprod,target,false,-1);
  return pQVar9;
}

Assistant:

QpVector& Basis::Zprod(const QpVector& rhs, QpVector& target) {
  buffer_Zprod.reset();
  buffer_Zprod.dim = target.dim;
  for (HighsInt i = 0; i < rhs.num_nz; i++) {
    HighsInt nz = rhs.index[i];
    HighsInt nonactive = non_active_constraint_index[nz];
    HighsInt idx = constraintindexinbasisfactor[nonactive];
    buffer_Zprod.index[i] = idx;
    buffer_Zprod.value[idx] = rhs.value[nz];
  }
  buffer_Zprod.num_nz = rhs.num_nz;
  return btran(buffer_Zprod, target);
}